

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

FILE * getiofile(lua_State *L,int findex)

{
  FILE *pFVar1;
  long *plVar2;
  int in_ESI;
  lua_State *in_RDI;
  FILE *f;
  
  lua_rawgeti((lua_State *)f,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  plVar2 = (long *)lua_touserdata(in_RDI,in_ESI);
  pFVar1 = (FILE *)*plVar2;
  if (pFVar1 == (FILE *)0x0) {
    luaL_error(in_RDI,"standard %s file is closed",fnames[in_ESI + -1]);
  }
  return pFVar1;
}

Assistant:

static FILE*getiofile(lua_State*L,int findex){
FILE*f;
lua_rawgeti(L,(-10001),findex);
f=*(FILE**)lua_touserdata(L,-1);
if(f==NULL)
luaL_error(L,"standard %s file is closed",fnames[findex-1]);
return f;
}